

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O2

int Nm_ManTableDelete(Nm_Man_t *p,int ObjId)

{
  Nm_Entry_t **ppNVar1;
  Nm_Entry_t *pNVar2;
  Nm_Entry_t *pNVar3;
  uint uVar4;
  int iVar5;
  Nm_Entry_t *pNVar6;
  Nm_Entry_t **ppNVar7;
  Nm_Entry_t *pNVar8;
  Nm_Entry_t *pNVar9;
  
  p->nEntries = p->nEntries + -1;
  pNVar6 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar6 == (Nm_Entry_t *)0x0) {
    __assert_fail("Nm_ManTableLookupId(p, ObjId) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x76,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  ppNVar1 = p->pBinsI2N;
  iVar5 = p->nBins;
  uVar4 = Nm_HashNumber(ObjId,iVar5);
  ppNVar1 = ppNVar1 + uVar4;
  do {
    ppNVar7 = ppNVar1;
    pNVar6 = *ppNVar7;
    ppNVar1 = &pNVar6->pNextI2N;
  } while (pNVar6->ObjId != ObjId);
  *ppNVar7 = pNVar6->pNextI2N;
  ppNVar1 = p->pBinsN2I;
  uVar4 = Nm_HashString((char *)(pNVar6 + 1),iVar5);
  ppNVar1 = ppNVar1 + uVar4;
  do {
    ppNVar7 = ppNVar1;
    pNVar2 = *ppNVar7;
    if (pNVar2 == (Nm_Entry_t *)0x0) break;
    ppNVar1 = &pNVar2->pNextN2I;
  } while (pNVar2 != pNVar6);
  if (pNVar2 == (Nm_Entry_t *)0x0) {
    pNVar9 = pNVar6->pNameSake;
    if (pNVar9 == (Nm_Entry_t *)0x0) {
      __assert_fail("fRemoved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8a,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
  }
  else {
    if (pNVar2 != pNVar6) {
      __assert_fail("*ppSpot == pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x84,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    *ppNVar7 = pNVar2->pNextN2I;
    pNVar9 = pNVar6->pNameSake;
    if (pNVar9 == (Nm_Entry_t *)0x0) {
      return 1;
    }
  }
  pNVar3 = pNVar6;
  if (pNVar9 == pNVar6) {
    __assert_fail("pEntry->pNameSake != pEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x8e,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  do {
    pNVar8 = pNVar3;
    pNVar3 = pNVar8->pNameSake;
  } while (pNVar8->pNameSake != pNVar6);
  iVar5 = strcmp((char *)(pNVar8 + 1),(char *)(pNVar6 + 1));
  if (iVar5 == 0) {
    pNVar6 = (Nm_Entry_t *)0x0;
    if (pNVar9 != pNVar8) {
      pNVar6 = pNVar9;
    }
    pNVar8->pNameSake = pNVar6;
    if (pNVar2 != (Nm_Entry_t *)0x0) {
      if (pNVar8->pNextN2I != (Nm_Entry_t *)0x0) {
        __assert_fail("pPrev->pNextN2I == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                      ,0x99,"int Nm_ManTableDelete(Nm_Man_t *, int)");
      }
      pNVar8->pNextN2I = *ppNVar7;
      *ppNVar7 = pNVar8;
    }
    return 1;
  }
  __assert_fail("!strcmp(pPrev->Name, pEntry->Name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                ,0x90,"int Nm_ManTableDelete(Nm_Man_t *, int)");
}

Assistant:

int Nm_ManTableDelete( Nm_Man_t * p, int ObjId )
{
    Nm_Entry_t ** ppSpot, * pEntry, * pPrev;
    int fRemoved;
    p->nEntries--;
    // remove the entry from the table Id->Name
    assert( Nm_ManTableLookupId(p, ObjId) != NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(ObjId, p->nBins);
    while ( (*ppSpot)->ObjId != (unsigned)ObjId )
        ppSpot = &(*ppSpot)->pNextI2N;
    pEntry = *ppSpot; 
    *ppSpot = (*ppSpot)->pNextI2N;
    // remove the entry from the table Name->Id
    ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
    while ( *ppSpot && *ppSpot != pEntry )
        ppSpot = &(*ppSpot)->pNextN2I;
    // remember if we found this one in the list
    fRemoved = (*ppSpot != NULL);
    if ( *ppSpot )
    {
        assert( *ppSpot == pEntry );
        *ppSpot = (*ppSpot)->pNextN2I;
    }
    // quit if this entry has no namesakes
    if ( pEntry->pNameSake == NULL )
    {
        assert( fRemoved );
        return 1;
    }
    // remove entry from the ring of namesakes
    assert( pEntry->pNameSake != pEntry );
    for ( pPrev = pEntry; pPrev->pNameSake != pEntry; pPrev = pPrev->pNameSake );
    assert( !strcmp(pPrev->Name, pEntry->Name) );
    assert( pPrev->pNameSake == pEntry );
    if ( pEntry->pNameSake == pPrev ) // two entries in the ring
        pPrev->pNameSake = NULL;
    else
        pPrev->pNameSake = pEntry->pNameSake;
    // reinsert the ring back if we removed its connection with the list in the table
    if ( fRemoved )
    {
        assert( pPrev->pNextN2I == NULL );
        pPrev->pNextN2I = *ppSpot;
        *ppSpot = pPrev;
    }
    return 1;
}